

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O0

int cram_flush(cram_fd *fd)

{
  int iVar1;
  cram_fd *fd_local;
  
  if (fd == (cram_fd *)0x0) {
    fd_local._4_4_ = -1;
  }
  else {
    if ((fd->mode == 0x77) && (fd->ctr != (cram_container *)0x0)) {
      if (fd->ctr->slice != (cram_slice *)0x0) {
        fd->ctr->curr_slice = fd->ctr->curr_slice + 1;
      }
      iVar1 = cram_flush_container_mt(fd,fd->ctr);
      if (iVar1 == -1) {
        return -1;
      }
    }
    fd_local._4_4_ = 0;
  }
  return fd_local._4_4_;
}

Assistant:

int cram_flush(cram_fd *fd) {
    if (!fd)
	return -1;

    if (fd->mode == 'w' && fd->ctr) {
	if(fd->ctr->slice)
	    fd->ctr->curr_slice++;
	if (-1 == cram_flush_container_mt(fd, fd->ctr))
	    return -1;
    }

    return 0;
}